

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_deviate_minmax(lys_deviate *deviate,lys_node *dev_target,uint32_t value,int type)

{
  ly_ctx *ctx_00;
  lys_iffeature **pplVar1;
  char *pcVar2;
  uint *local_50;
  uint *local_48;
  uint32_t *max;
  uint32_t *min;
  uint32_t *ui32val;
  ly_ctx *ctx;
  int type_local;
  uint32_t value_local;
  lys_node *dev_target_local;
  lys_deviate *deviate_local;
  
  ctx_00 = dev_target->module->ctx;
  if (dev_target->nodetype == LYS_LEAFLIST) {
    pplVar1 = (lys_iffeature **)&dev_target[1].priv;
    max = (uint32_t *)&dev_target[1].priv;
  }
  else {
    if (dev_target->nodetype != LYS_LIST) {
      pcVar2 = "min-elements";
      if (type != 0) {
        pcVar2 = "max-elements";
      }
      ly_vlog(ctx_00,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,pcVar2);
      pcVar2 = "min-elements";
      if (type != 0) {
        pcVar2 = "max-elements";
      }
      ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"%s\" property."
              ,pcVar2);
      return 1;
    }
    pplVar1 = &dev_target[1].iffeature;
    max = (uint32_t *)&dev_target[1].iffeature;
  }
  local_48 = (uint *)((long)pplVar1 + 4);
  if (type == 0) {
    local_50 = max;
  }
  else {
    local_50 = local_48;
  }
  if ((deviate->mod == LY_DEVIATE_ADD) && (*local_50 != 0)) {
    pcVar2 = "min-elements";
    if (type != 0) {
      pcVar2 = "max-elements";
    }
    ly_vlog(ctx_00,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,pcVar2);
    ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Adding property that already exists.");
  }
  else {
    *local_50 = value;
    if ((*local_48 == 0) || (*max <= *local_48)) {
      return 0;
    }
    if (type == 0) {
      ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Invalid value \"%d\" of \"min-elements\".",
              (ulong)value);
      ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "\"min-elements\" is bigger than \"max-elements\".");
    }
    else {
      ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Invalid value \"%d\" of \"max-elements\".",
              (ulong)value);
      ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "\"max-elements\" is smaller than \"min-elements\".");
    }
  }
  return 1;
}

Assistant:

int
yang_read_deviate_minmax(struct lys_deviate *deviate, struct lys_node *dev_target, uint32_t value, int type)
{
    struct ly_ctx *ctx = dev_target->module->ctx;
    uint32_t *ui32val, *min, *max;

    /* check target node type */
    if (dev_target->nodetype == LYS_LEAFLIST) {
        max = &((struct lys_node_leaflist *)dev_target)->max;
        min = &((struct lys_node_leaflist *)dev_target)->min;
    } else if (dev_target->nodetype == LYS_LIST) {
        max = &((struct lys_node_list *)dev_target)->max;
        min = &((struct lys_node_list *)dev_target)->min;
    } else {
        LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, (type) ? "max-elements" : "min-elements");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"%s\" property.", (type) ? "max-elements" : "min-elements");
        goto error;
    }

    ui32val = (type) ? max : min;
    if (deviate->mod == LY_DEVIATE_ADD) {
        /* check that there is no current value */
        if (*ui32val) {
            LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, (type) ? "max-elements" : "min-elements");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Adding property that already exists.");
            goto error;
        }
    } else if (deviate->mod == LY_DEVIATE_RPL) {
        /* unfortunately, there is no way to check reliably that there
         * was a value before, it could have been the default */
    }

    /* add (already checked) and replace */
    /* set new value specified in deviation */
    *ui32val = value;

    /* check min-elements is smaller than max-elements */
    if (*max && *min > *max) {
        if (type) {
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid value \"%d\" of \"max-elements\".", value);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "\"max-elements\" is smaller than \"min-elements\".");
        } else {
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid value \"%d\" of \"min-elements\".", value);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "\"min-elements\" is bigger than \"max-elements\".");
        }
        goto error;
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}